

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O1

int run_test_thread_mutex_recursive(void)

{
  int iVar1;
  int extraout_EAX;
  uv_mutex_t *unaff_RBX;
  uv_mutex_t mutex;
  uv_thread_t uStack_90;
  uv_mutex_t *puStack_88;
  uv_rwlock_t uStack_78;
  uv_mutex_t *puStack_40;
  uv_mutex_t local_30;
  
  puStack_40 = (uv_mutex_t *)0x161afc;
  iVar1 = uv_mutex_init_recursive(&local_30);
  if (iVar1 == 0) {
    unaff_RBX = &local_30;
    puStack_40 = (uv_mutex_t *)0x161b0d;
    uv_mutex_lock(unaff_RBX);
    puStack_40 = (uv_mutex_t *)0x161b15;
    uv_mutex_lock(unaff_RBX);
    puStack_40 = (uv_mutex_t *)0x161b1d;
    iVar1 = uv_mutex_trylock(unaff_RBX);
    if (iVar1 == 0) {
      puStack_40 = (uv_mutex_t *)0x161b2e;
      uv_mutex_unlock(&local_30);
      puStack_40 = (uv_mutex_t *)0x161b36;
      uv_mutex_unlock(&local_30);
      puStack_40 = (uv_mutex_t *)0x161b3e;
      uv_mutex_unlock(&local_30);
      puStack_40 = (uv_mutex_t *)0x161b46;
      uv_mutex_destroy(&local_30);
      return 0;
    }
  }
  else {
    puStack_40 = (uv_mutex_t *)0x161b53;
    run_test_thread_mutex_recursive_cold_1();
  }
  puStack_40 = (uv_mutex_t *)run_test_thread_rwlock;
  run_test_thread_mutex_recursive_cold_2();
  puStack_88 = (uv_mutex_t *)0x161b67;
  puStack_40 = unaff_RBX;
  iVar1 = uv_rwlock_init(&uStack_78);
  if (iVar1 == 0) {
    puStack_88 = (uv_mutex_t *)0x161b78;
    uv_rwlock_rdlock(&uStack_78);
    puStack_88 = (uv_mutex_t *)0x161b80;
    uv_rwlock_rdunlock(&uStack_78);
    puStack_88 = (uv_mutex_t *)0x161b88;
    uv_rwlock_wrlock(&uStack_78);
    puStack_88 = (uv_mutex_t *)0x161b90;
    uv_rwlock_wrunlock(&uStack_78);
    puStack_88 = (uv_mutex_t *)0x161b98;
    uv_rwlock_destroy(&uStack_78);
    return 0;
  }
  puStack_88 = (uv_mutex_t *)run_test_thread_rwlock_trylock;
  run_test_thread_rwlock_cold_1();
  puStack_88 = unaff_RBX;
  iVar1 = uv_cond_init(&condvar);
  if (iVar1 == 0) {
    iVar1 = uv_mutex_init(&::mutex);
    if (iVar1 != 0) goto LAB_00161d08;
    iVar1 = uv_rwlock_init(&rwlock);
    if (iVar1 != 0) goto LAB_00161d0d;
    uv_mutex_lock(&::mutex);
    iVar1 = uv_thread_create(&uStack_90,thread_rwlock_trylock_peer,(void *)0x0);
    if (iVar1 != 0) goto LAB_00161d12;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_00161d17;
    synchronize();
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00161d1c;
    synchronize();
    uv_rwlock_rdunlock(&rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161d21;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161d26;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00161d2b;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161d30;
    synchronize();
    iVar1 = uv_thread_join(&uStack_90);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&rwlock);
      uv_mutex_unlock(&::mutex);
      uv_mutex_destroy(&::mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_00161d08:
    run_test_thread_rwlock_trylock_cold_2();
LAB_00161d0d:
    run_test_thread_rwlock_trylock_cold_3();
LAB_00161d12:
    run_test_thread_rwlock_trylock_cold_4();
LAB_00161d17:
    run_test_thread_rwlock_trylock_cold_5();
LAB_00161d1c:
    run_test_thread_rwlock_trylock_cold_6();
LAB_00161d21:
    run_test_thread_rwlock_trylock_cold_7();
LAB_00161d26:
    run_test_thread_rwlock_trylock_cold_8();
LAB_00161d2b:
    run_test_thread_rwlock_trylock_cold_9();
LAB_00161d30:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&::mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161e10;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00161e15;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161e1a;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_wrunlock(&rwlock);
      iVar1 = uv_rwlock_tryrdlock(&rwlock);
      if (iVar1 == 0) {
        synchronize();
        uv_rwlock_rdunlock(&rwlock);
        step = step + 1;
        uv_cond_signal(&condvar);
        uv_mutex_unlock(&::mutex);
        return extraout_EAX;
      }
      goto LAB_00161e24;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_00161e10:
    thread_rwlock_trylock_peer_cold_2();
LAB_00161e15:
    thread_rwlock_trylock_peer_cold_3();
LAB_00161e1a:
    thread_rwlock_trylock_peer_cold_4();
  }
  thread_rwlock_trylock_peer_cold_5();
LAB_00161e24:
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  uv_cond_signal(&condvar);
  iVar1 = step;
  do {
    uv_cond_wait(&condvar,&::mutex);
  } while (iVar1 == step);
  if (step == iVar1 + 1) {
    return step;
  }
  synchronize_cold_1();
  return 0;
}

Assistant:

TEST_IMPL(thread_mutex_recursive) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init_recursive(&mutex);
  ASSERT(r == 0);

  uv_mutex_lock(&mutex);
  uv_mutex_lock(&mutex);
  ASSERT(0 == uv_mutex_trylock(&mutex));

  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}